

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::TestCaseTracking::ITracker> * __thiscall
Catch::Ptr<Catch::TestCaseTracking::ITracker>::operator=
          (Ptr<Catch::TestCaseTracking::ITracker> *this,ITracker *p)

{
  Ptr<Catch::TestCaseTracking::ITracker> local_20;
  Ptr<Catch::TestCaseTracking::ITracker> temp;
  ITracker *p_local;
  Ptr<Catch::TestCaseTracking::ITracker> *this_local;
  
  temp.m_p = p;
  Ptr(&local_20,p);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }